

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int changeTempStorage(Parse *pParse,char *zStorageType)

{
  byte bVar1;
  byte bVar2;
  sqlite3 *psVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  
  bVar4 = *zStorageType - 0x30;
  if (2 < bVar4) {
    lVar6 = 0;
    do {
      bVar2 = zStorageType[lVar6];
      bVar1 = "parse - fills database with entries from a file"[lVar6 + 0x2b];
      if (bVar2 == bVar1) {
        if ((ulong)bVar2 == 0) goto LAB_001ba2ad;
      }
      else if (""[bVar2] != ""[bVar1]) goto LAB_001ba2ad;
      lVar6 = lVar6 + 1;
    } while( true );
  }
  goto LAB_001ba2ee;
LAB_001ba2e5:
  bVar4 = 2;
  goto LAB_001ba2ee;
LAB_001ba2ad:
  bVar4 = 1;
  if (bVar2 != bVar1) {
    lVar6 = 0;
    do {
      bVar4 = zStorageType[lVar6];
      if (bVar4 == "failed to allocate %u bytes of memory"[lVar6 + 0x1f]) {
        if ((ulong)bVar4 == 0) goto LAB_001ba2e5;
      }
      else if (""[bVar4] != ""[(byte)"failed to allocate %u bytes of memory"[lVar6 + 0x1f]]) {
        bVar4 = 0;
        break;
      }
      lVar6 = lVar6 + 1;
    } while( true );
  }
LAB_001ba2ee:
  psVar3 = pParse->db;
  bVar2 = psVar3->temp_store;
  uVar5 = (uint)bVar2;
  if ((bVar4 != bVar2) && (uVar5 = invalidateTempStorage(pParse), uVar5 == 0)) {
    psVar3->temp_store = bVar4;
  }
  return uVar5;
}

Assistant:

static int changeTempStorage(Parse *pParse, const char *zStorageType){
  int ts = getTempStore(zStorageType);
  sqlite3 *db = pParse->db;
  if( db->temp_store==ts ) return SQLITE_OK;
  if( invalidateTempStorage( pParse ) != SQLITE_OK ){
    return SQLITE_ERROR;
  }
  db->temp_store = (u8)ts;
  return SQLITE_OK;
}